

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::ConstantDerivateCase::ConstantDerivateCase
          (ConstantDerivateCase *this,TestContext *testCtx,string *name,string *description,
          DerivateFunc func,DataType type)

{
  DerivateUniformSetup *this_00;
  DataType type_local;
  DerivateFunc func_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  ConstantDerivateCase *this_local;
  
  this_00 = (DerivateUniformSetup *)operator_new(0x18);
  DerivateUniformSetup::DerivateUniformSetup(this_00,false);
  TriangleDerivateCase::TriangleDerivateCase
            (&this->super_TriangleDerivateCase,testCtx,name,description,(UniformSetup *)this_00);
  (this->super_TriangleDerivateCase).super_ShaderRenderCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__ConstantDerivateCase_01664700;
  (this->super_TriangleDerivateCase).m_definitions.func = func;
  (this->super_TriangleDerivateCase).m_definitions.dataType = type;
  (this->super_TriangleDerivateCase).m_definitions.precision = PRECISION_HIGHP;
  return;
}

Assistant:

ConstantDerivateCase::ConstantDerivateCase (tcu::TestContext&		testCtx,
											const std::string&		name,
											const std::string&		description,
											DerivateFunc			func,
											glu::DataType			type)
	: TriangleDerivateCase	(testCtx, name, description, new DerivateUniformSetup(false))
{
	m_definitions.func				= func;
	m_definitions.dataType			= type;
	m_definitions.precision			= glu::PRECISION_HIGHP;
}